

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O2

void __thiscall
duckdb::Deserializer::ReadPropertyWithExplicitDefault<duckdb::vector<duckdb::Value,true>>
          (Deserializer *this,field_id_t field_id,char *tag,vector<duckdb::Value,_true> *ret,
          vector<duckdb::Value,_true> *default_value)

{
  int iVar1;
  undefined6 in_register_00000032;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> local_30 [24];
  
  iVar1 = (*this->_vptr_Deserializer[4])(this,CONCAT62(in_register_00000032,field_id));
  if ((char)iVar1 != '\0') {
    Read<duckdb::vector<duckdb::Value,true>>((type *)local_30,this);
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::_M_move_assign
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)ret,local_30);
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector(local_30);
    (*this->_vptr_Deserializer[5])(this,1);
    return;
  }
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::_M_move_assign
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)ret,default_value);
  (*this->_vptr_Deserializer[5])(this,0);
  return;
}

Assistant:

inline void ReadPropertyWithExplicitDefault(const field_id_t field_id, const char *tag, T &ret, T default_value) {
		if (!OnOptionalPropertyBegin(field_id, tag)) {
			ret = std::forward<T>(default_value);
			OnOptionalPropertyEnd(false);
			return;
		}
		ret = Read<T>();
		OnOptionalPropertyEnd(true);
	}